

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

int __thiscall SBarInfo::newImage(SBarInfo *this,char *patchname)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FString *this_00;
  char *__s1;
  FString local_30;
  uint local_24;
  char *pcStack_20;
  uint i;
  char *patchname_local;
  SBarInfo *this_local;
  
  if ((*patchname != '\0') &&
     (pcStack_20 = patchname, patchname_local = (char *)this,
     iVar2 = strcasecmp(patchname,"nullimage"), iVar2 != 0)) {
    local_24 = 0;
    while( true ) {
      uVar1 = local_24;
      uVar3 = TArray<FString,_FString>::Size(&this->Images);
      if (uVar3 <= uVar1) {
        FString::FString(&local_30,pcStack_20);
        this_local._4_4_ = TArray<FString,_FString>::Push(&this->Images,&local_30);
        FString::~FString(&local_30);
        return this_local._4_4_;
      }
      this_00 = TArray<FString,_FString>::operator[](&this->Images,(ulong)local_24);
      __s1 = FString::operator_cast_to_char_(this_00);
      iVar2 = strcasecmp(__s1,pcStack_20);
      if (iVar2 == 0) break;
      local_24 = local_24 + 1;
    }
    return local_24;
  }
  return -1;
}

Assistant:

int SBarInfo::newImage(const char *patchname)
{
	if(patchname[0] == '\0' || stricmp(patchname, "nullimage") == 0)
	{
		return -1;
	}
	for(unsigned int i = 0;i < this->Images.Size();i++) //did we already load it?
	{
		if(stricmp(this->Images[i], patchname) == 0)
		{
			return i;
		}
	}
	return this->Images.Push(patchname);
}